

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

void Assimp::IFC::FindLikelyCrossingLines(iterator current)

{
  bool bVar1;
  reference pPVar2;
  SkipList *this;
  difference_type dVar3;
  reference v1;
  size_type sVar4;
  IFC *this_00;
  reference local_b8;
  aiVector2t<double> local_a8;
  IfcVector2 *local_98;
  aiVector2t<double> *local_90;
  reference local_88;
  double local_78;
  double local_70;
  undefined1 local_68 [8];
  IfcVector2 vdelta;
  IfcVector2 *proj_point;
  const_iterator cit;
  __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
  local_40;
  const_iterator cend;
  __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
  local_30;
  const_iterator cbegin;
  IfcVector2 last_proj_point;
  SkipList *skiplist;
  iterator current_local;
  
  skiplist = (SkipList *)current._M_current;
  pPVar2 = __gnu_cxx::
           __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
           ::operator*((__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                        *)&skiplist);
  this = &pPVar2->skiplist;
  aiVector2t<double>::aiVector2t((aiVector2t<double> *)&cbegin);
  pPVar2 = __gnu_cxx::
           __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
           ::operator*((__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                        *)&skiplist);
  cend._M_current =
       (aiVector2t<double> *)
       std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin
                 (&pPVar2->contour);
  __gnu_cxx::
  __normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
  ::__normal_iterator<aiVector2t<double>*>
            ((__normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
              *)&local_30,
             (__normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
              *)&cend);
  pPVar2 = __gnu_cxx::
           __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
           ::operator*((__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                        *)&skiplist);
  cit._M_current =
       (aiVector2t<double> *)
       std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::end(&pPVar2->contour);
  __gnu_cxx::
  __normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
  ::__normal_iterator<aiVector2t<double>*>
            ((__normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
              *)&local_40,
             (__normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
              *)&cit);
  proj_point = local_30._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                             *)&proj_point,&local_40), bVar1) {
    vdelta.y = (double)__gnu_cxx::
                       __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                       ::operator*((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                    *)&proj_point);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                        *)&proj_point,&local_30);
    if (bVar1) {
      this_00 = (IFC *)vdelta.y;
      _local_68 = ::operator-((aiVector2t<double> *)vdelta.y,(aiVector2t<double> *)&cbegin);
      local_78 = (double)local_68;
      local_70 = vdelta.x;
      bVar1 = LikelyDiagonal(this_00,_local_68);
      if (bVar1) {
        local_90 = local_30._M_current;
        local_98 = proj_point;
        dVar3 = std::
                distance<__gnu_cxx::__normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>>
                          (local_30,(__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                     )proj_point);
        local_88 = std::vector<bool,_std::allocator<bool>_>::operator[](this,dVar3 - 1);
        std::_Bit_reference::operator=(&local_88,true);
      }
    }
    cbegin._M_current = *(aiVector2t<double> **)vdelta.y;
    __gnu_cxx::
    __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
    ::operator++((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                  *)&proj_point);
  }
  v1 = __gnu_cxx::
       __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
       ::operator*(&local_30);
  local_a8 = ::operator-(v1,(aiVector2t<double> *)&cbegin);
  bVar1 = LikelyDiagonal((IFC *)v1,local_a8);
  if (bVar1) {
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size(this);
    local_b8 = std::vector<bool,_std::allocator<bool>_>::operator[](this,sVar4 - 1);
    std::_Bit_reference::operator=(&local_b8,true);
  }
  return;
}

Assistant:

void FindLikelyCrossingLines(ContourVector::iterator current)
{
    SkipList& skiplist = (*current).skiplist;
    IfcVector2 last_proj_point;

    const Contour::const_iterator cbegin = (*current).contour.begin(), cend = (*current).contour.end();
    for (Contour::const_iterator cit = cbegin; cit != cend; ++cit) {
        const IfcVector2& proj_point = *cit;

        if (cit != cbegin) {
            IfcVector2 vdelta = proj_point - last_proj_point;
            if (LikelyDiagonal(vdelta)) {
                skiplist[std::distance(cbegin, cit) - 1] = true;
            }
        }

        last_proj_point = proj_point;
    }

    // handle last segment
    if (LikelyDiagonal(*cbegin - last_proj_point)) {
        skiplist[skiplist.size()-1] = true;
    }
}